

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_duplicates_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::RemoveDuplicatesPass::Process(RemoveDuplicatesPass *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Status SVar5;
  bool modified;
  RemoveDuplicatesPass *this_local;
  
  bVar1 = RemoveDuplicateCapabilities(this);
  bVar2 = RemoveDuplicatesExtInstImports(this);
  bVar3 = RemoveDuplicateTypes(this);
  bVar4 = RemoveDuplicateDecorations(this);
  SVar5 = SuccessWithoutChange;
  if (((bVar1 || bVar2) || bVar3) || bVar4) {
    SVar5 = SuccessWithChange;
  }
  return SVar5;
}

Assistant:

Pass::Status RemoveDuplicatesPass::Process() {
  bool modified = RemoveDuplicateCapabilities();
  modified |= RemoveDuplicatesExtInstImports();
  modified |= RemoveDuplicateTypes();
  modified |= RemoveDuplicateDecorations();

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}